

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O3

int parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  char netrcbuffer [4096];
  int local_1074;
  byte local_1038 [4104];
  
  pcVar1 = *loginp;
  pcVar2 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  pcVar8 = Curl_get_line((char *)local_1038,0x1000,(FILE *)__stream);
  if (pcVar8 != (char *)0x0) {
    uVar9 = 0;
LAB_006a169b:
    if (((uVar9 != 3) || (uVar9 = 0, local_1038[0] == 0xd)) || (uVar5 = 3, local_1038[0] == 10)) {
      pbVar11 = local_1038 + 2;
      pbVar10 = local_1038;
      do {
        bVar6 = *pbVar10;
        uVar5 = uVar9;
        if (bVar6 < 0x20) {
          if (bVar6 != 9) {
            if (bVar6 != 0) goto LAB_006a16f7;
            break;
          }
        }
        else if (bVar6 != 0x20) goto LAB_006a16cf;
        pbVar10 = pbVar10 + 1;
        pbVar11 = pbVar11 + 1;
      } while( true );
    }
    goto LAB_006a1a5e;
  }
  goto LAB_006a1a9e;
LAB_006a16cf:
  if (bVar6 == 0x22) {
    bVar6 = pbVar10[1];
    if (bVar6 != 0) {
      bVar4 = false;
      goto LAB_006a1721;
    }
    *pbVar10 = 0;
    local_1074 = -1;
    goto LAB_006a1aa8;
  }
  if (bVar6 != 0x23) goto LAB_006a16f7;
LAB_006a1a5e:
  uVar9 = uVar5;
  pcVar8 = Curl_get_line((char *)local_1038,0x1000,(FILE *)__stream);
  if (pcVar8 == (char *)0x0) goto LAB_006a1a9e;
  goto LAB_006a169b;
LAB_006a16f7:
  while (((bVar6 != 9 && (bVar6 != 0x20)) && ((byte)(bVar6 - 0xe) < 0xfc))) {
    pbVar11 = pbVar10 + 1;
    pbVar10 = pbVar10 + 1;
    bVar6 = *pbVar11;
  }
  *pbVar10 = 0;
  goto LAB_006a178a;
LAB_006a1721:
  do {
    if (bVar4) {
      if (bVar6 == 0x74) {
        bVar6 = 9;
      }
      else if (bVar6 == 0x72) {
        bVar6 = 0xd;
      }
      else if (bVar6 == 0x6e) {
        bVar6 = 10;
      }
      bVar4 = false;
LAB_006a1757:
      *pbVar10 = bVar6;
      pbVar10 = pbVar10 + 1;
    }
    else {
      if (bVar6 != 0x5c) {
        if (bVar6 != 0x22) goto LAB_006a1757;
        bVar3 = false;
        goto LAB_006a1770;
      }
      bVar4 = true;
    }
    bVar6 = *pbVar11;
    pbVar11 = pbVar11 + 1;
  } while (bVar6 != 0);
  bVar3 = true;
LAB_006a1770:
  *pbVar10 = 0;
  local_1074 = -1;
  if ((bVar4) || (bVar3)) goto LAB_006a1aa8;
LAB_006a178a:
  if ((((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) || (pcVar2 == (char *)0x0)) ||
     (*pcVar2 == '\0')) {
    iVar7 = (*(code *)(&DAT_008ee0d0 + *(int *)(&DAT_008ee0d0 + (ulong)uVar9 * 4)))();
    return iVar7;
  }
LAB_006a1a9e:
  local_1074 = 1;
LAB_006a1aa8:
  fclose(__stream);
  return local_1074;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = TRUE;  /* With specific_login, found *our* login
                                  name (or login-less line) */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && Curl_get_line(netrcbuffer, netrcbuffsize, file)) {
      char *tok;
      char *tok_end;
      bool quoted;
      if(state == MACDEF) {
        if((netrcbuffer[0] == '\n') || (netrcbuffer[0] == '\r'))
          state = NOTHING;
        else
          continue;
      }
      tok = netrcbuffer;
      while(tok) {
        while(ISBLANK(*tok))
          tok++;
        /* tok is first non-space letter */
        if(!*tok || (*tok == '#'))
          /* end of line or the rest is a comment */
          break;

        /* leading double-quote means quoted string */
        quoted = (*tok == '\"');

        tok_end = tok;
        if(!quoted) {
          while(!ISSPACE(*tok_end))
            tok_end++;
          *tok_end = 0;
        }
        else {
          bool escape = FALSE;
          bool endquote = FALSE;
          char *store = tok;
          tok_end++; /* pass the leading quote */
          while(*tok_end) {
            char s = *tok_end;
            if(escape) {
              escape = FALSE;
              switch(s) {
              case 'n':
                s = '\n';
                break;
              case 'r':
                s = '\r';
                break;
              case 't':
                s = '\t';
                break;
              }
            }
            else if(s == '\\') {
              escape = TRUE;
              tok_end++;
              continue;
            }
            else if(s == '\"') {
              tok_end++; /* pass the ending quote */
              endquote = TRUE;
              break;
            }
            *store++ = s;
            tok_end++;
          }
          *store = 0;
          if(escape || !endquote) {
            /* bad syntax, get out */
            retcode = NETRC_FAILED;
            goto out;
          }
        }

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("macdef", tok)) {
            /* Define a macro. A macro is defined with the specified name; its
               contents begin with the next .netrc line and continue until a
               null line (consecutive new-line characters) is encountered. */
            state = MACDEF;
          }
          else if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case MACDEF:
          if(!strlen(tok)) {
            state = NOTHING;
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = !Curl_timestrcmp(login, tok);
            }
            else if(!login || Curl_timestrcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
               && (!password || Curl_timestrcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */
        tok = ++tok_end;
      }
    } /* while Curl_get_line() */

out:
    if(!retcode) {
      /* success */
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}